

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O3

void __thiscall
groundupdbext::FileKeyValueStore::setKeyValue
          (FileKeyValueStore *this,HashedValue *key,EncodedValue *value)

{
  Impl *pIVar1;
  long lVar2;
  bool bVar3;
  pointer pbVar4;
  FileKeyValueStore *pFVar5;
  char cVar6;
  size_t __val;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  size_t sVar10;
  size_t sVar11;
  long *plVar12;
  char cVar13;
  byte *b;
  pointer *ppbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string keyHash;
  ofstream os;
  undefined1 auStack_2c8 [8];
  Bytes local_2c0;
  long lStack_2a8;
  long *local_2a0 [2];
  long local_290 [2];
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  long *local_260;
  uint local_258;
  long local_250 [2];
  HashedValue *local_240;
  FileKeyValueStore *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  __val = groundupdb::HashedValue::hash(key);
  cVar13 = '\x01';
  if (9 < __val) {
    sVar11 = __val;
    cVar6 = '\x04';
    do {
      cVar13 = cVar6;
      if (sVar11 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0019318e;
      }
      if (sVar11 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0019318e;
      }
      if (sVar11 < 10000) goto LAB_0019318e;
      bVar3 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar6 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0019318e:
  local_260 = local_250;
  std::__cxx11::string::_M_construct((ulong)&local_260,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_260,local_258,__val);
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pIVar1->m_fullpath)._M_dataplus;
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,lVar2,(pIVar1->m_fullpath)._M_string_length + lVar2);
  std::__cxx11::string::append((char *)local_2a0);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_260);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_270 = *plVar12;
    lStack_268 = plVar7[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar12;
    local_280 = (long *)*plVar7;
  }
  local_278 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
  local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  plVar7 = puVar8 + 2;
  if ((pointer *)*puVar8 == (pointer *)plVar7) {
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
    lStack_2a8 = puVar8[3];
  }
  else {
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar8;
  }
  local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2c0);
  if ((pointer *)
      local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  poVar9 = std::ostream::_M_insert<bool>(SUB81(&local_230,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  poVar9 = groundupdb::operator<<((ostream *)&local_230,value->m_type);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  local_240 = &value->m_value;
  groundupdb::HashedValue::length(local_240);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  local_238 = this;
  groundupdb::HashedValue::data(&local_2c0,local_240);
  pbVar4 = local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppbVar14 = (pointer *)
               local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      local_280 = (long *)CONCAT71(local_280._1_7_,*(undefined1 *)ppbVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_280,1)
      ;
      ppbVar14 = (pointer *)((long)ppbVar14 + 1);
    } while (ppbVar14 != (pointer *)pbVar4);
  }
  if ((pointer *)
      local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  pFVar5 = local_238;
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  groundupdb::HashedValue::hash(local_240);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ofstream::close();
  pIVar1 = (pFVar5->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pIVar1->m_fullpath)._M_dataplus;
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,lVar2,(pIVar1->m_fullpath)._M_string_length + lVar2);
  std::__cxx11::string::append((char *)local_2a0);
  ppbVar14 = &local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_260);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_270 = *plVar12;
    lStack_268 = plVar7[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar12;
    local_280 = (long *)*plVar7;
  }
  local_278 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
  plVar12 = plVar7 + 2;
  if ((pointer *)*plVar7 == (pointer *)plVar12) {
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    lStack_2a8 = plVar7[3];
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppbVar14;
  }
  else {
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar12;
    local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar7;
  }
  local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2c0);
  if ((pointer *)
      local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != ppbVar14) {
    operator_delete(local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_2c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  poVar9 = groundupdb::operator<<((ostream *)&local_230,value->m_type);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  plVar7 = local_260;
  if (local_260 == (long *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
  }
  else {
    sVar10 = strlen((char *)local_260);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)plVar7,sVar10);
  }
  std::ofstream::close();
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _setbuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void
FileKeyValueStore::setKeyValue(const HashedValue& key,EncodedValue&& value)
{
  std::ofstream os;
  std::string keyHash(std::to_string(key.hash()));
  os.open(mImpl->m_fullpath + "/" + keyHash + ".kv",
          std::ios::out | std::ios::trunc);
  os << value.hasValue() << std::endl;
  os << value.type() << std::endl;
  os << value.length() << std::endl;
  for (auto& b : value.data()) {
    os << (const char)b;
  }
  os << std::endl;
  os << value.hash() << std::endl;
  os.close();
  // TODO allow multiple keys for this hash (read, modify, write)
  os.open(mImpl->m_fullpath + "/" + keyHash + ".key",
          std::ios::out | std::ios::trunc);
  os << value.type() << std::endl;
  os << keyHash.c_str();
  os.close();
}